

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrink-explosion-protection.cpp
# Opt level: O3

void checkShrinkExplosions_PairIntegral<long>(void)

{
  pointer plVar1;
  pointer plVar2;
  long lVar3;
  pointer plVar4;
  long *plVar5;
  long *plVar6;
  pointer plVar7;
  initializer_list<long> __l;
  vector<long,_std::allocator<long>_> fixtures;
  allocator_type local_89;
  vector<long,_std::allocator<long>_> local_88;
  long local_70 [9];
  
  plVar5 = &DAT_001f32b8;
  plVar6 = local_70;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  __l._M_len = 9;
  __l._M_array = local_70;
  std::vector<long,_std::allocator<long>_>::vector(&local_88,__l,&local_89);
  plVar2 = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar7 = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  plVar1 = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (plVar4 = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start; plVar4 != plVar2; plVar4 = plVar4 + 1) {
    local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = plVar7;
    local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar1;
    if (plVar7 != plVar1) {
      lVar3 = *plVar4;
      do {
        checkShrinkExplosions<std::pair<long,long>,checkShrinkExplosions_PairIntegral<long>()::_lambda(std::pair<long,long>)_1_,1000,1000>
                  (lVar3,*plVar7);
        plVar7 = plVar7 + 1;
      } while (plVar7 != plVar1);
    }
    plVar7 = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar1 = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (plVar7 != (pointer)0x0) {
    operator_delete(plVar7);
  }
  return;
}

Assistant:

void checkShrinkExplosions_PairIntegral() {
  std::vector<IntegralType> fixtures = {
      IntegralType(1),
      IntegralType(-1),
      IntegralType(3),
      IntegralType(-3),
      IntegralType(100),
      IntegralType(5555),
      IntegralType(-5555),
      std::numeric_limits<IntegralType>::min(),
      std::numeric_limits<IntegralType>::max()};
  for (IntegralType a : fixtures) {
    for (IntegralType b : fixtures) {
      checkShrinkExplosions<std::pair<IntegralType, IntegralType>>(
          std::make_pair(a, b), [](std::pair<IntegralType, IntegralType> x) {
            return Arbitrary<std::pair<IntegralType, IntegralType>>::shrink(x);
          });
    }
  }
}